

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseException.h
# Opt level: O2

void __thiscall
AutoArgParse::RepeatedFlagException::~RepeatedFlagException(RepeatedFlagException *this)

{
  *(undefined ***)&this->super_ParseException = &PTR__RepeatedFlagException_001109f8;
  std::__cxx11::string::~string((string *)&this->repeatedFlag);
  ParseException::~ParseException(&this->super_ParseException);
  return;
}

Assistant:

RepeatedFlagException(std::string repeatedFlag)
        : ParseException(REPEATED_FLAG, makeErrorMessage(repeatedFlag)),
          repeatedFlag(std::move(repeatedFlag)) {}